

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_generation_iterator.cpp
# Opt level: O1

void __thiscall
GenerationIterator_GenerationContainerBegin_Test::TestBody
          (GenerationIterator_GenerationContainerBegin_Test *this)

{
  database *pdVar1;
  char *message;
  AssertionResult gtest_ar;
  generation_iterator expected;
  generation_iterator actual;
  Message local_70;
  AssertHelper local_68;
  internal local_60 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  not_null<const_pstore::database_*> local_50;
  generation_iterator local_48;
  generation_iterator local_38;
  
  anon_unknown.dwarf_1656a7::GenerationIterator::add_transaction(&this->super_GenerationIterator);
  pdVar1 = &(this->super_GenerationIterator).db_;
  local_48.db_ = pdVar1;
  local_38 = pstore::generation_container::begin((generation_container *)&local_48);
  local_50.ptr_ = pdVar1;
  pstore::gsl::not_null<const_pstore::database_*>::ensure_invariant(&local_50);
  local_48.pos_.a_.a_ = (address)(this->super_GenerationIterator).db_.size_.footer_pos_.a_.a_;
  local_48.db_ = local_50.ptr_;
  pstore::generation_iterator::validate(&local_48);
  testing::internal::CmpHelperEQ<pstore::generation_iterator,pstore::generation_iterator>
            (local_60,"expected","actual",&local_48,&local_38);
  if (local_60[0] == (internal)0x0) {
    testing::Message::Message(&local_70);
    if (local_58 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_58->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_generation_iterator.cpp"
               ,0x46,message);
    testing::internal::AssertHelper::operator=(&local_68,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if (local_70.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
        (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )0x0) {
      (**(code **)(*(long *)local_70.ss_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
  }
  if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_58,local_58);
  }
  return;
}

Assistant:

TEST_F (GenerationIterator, GenerationContainerBegin) {
    this->add_transaction ();

    auto & d = this->db ();
    generation_iterator const actual = generation_container{d}.begin ();
    generation_iterator const expected = generation_iterator{&d, d.footer_pos ()};
    EXPECT_EQ (expected, actual);
}